

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pltcalc.cpp
# Opt level: O0

void pltcalc::getperiodweights(void)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  double dVar4;
  key_type local_20;
  undefined1 auStack_1c [4];
  Periods p;
  int i;
  FILE *fin;
  
  register0x00000000 = fopen("input/periods.bin","rb");
  if (register0x00000000 == (FILE *)0x0) {
    unique0x1000007a = (FILE *)0x0;
    for (p.weighting._0_4_ = 1; p.weighting._0_4_ <= no_of_periods_;
        p.weighting._0_4_ = p.weighting._0_4_ + 1) {
      dVar4 = (double)no_of_periods_;
      pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)period_weights_,(key_type *)&p.weighting);
      *pmVar2 = 1.0 / dVar4;
    }
  }
  else {
    while (sVar3 = fread(&local_20,0xc,1,stack0xfffffffffffffff0), mVar1 = _auStack_1c, sVar3 != 0)
    {
      pmVar2 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)period_weights_,&local_20);
      *pmVar2 = mVar1;
    }
    fclose(stack0xfffffffffffffff0);
  }
  return;
}

Assistant:

void getperiodweights()
	{

		FILE *fin = fopen(PERIODS_FILE, "rb");

		// If there is no periods file, period weights are reciprocal
		// of number of periods
		if (fin == nullptr) {
			for (int i = 1; i <= no_of_periods_; i++) {
				period_weights_[i] = 1 / (double)no_of_periods_;
			}
			return;
		}

		Periods p;
		while (fread(&p, sizeof(Periods), 1, fin) != 0){
			period_weights_[p.period_no] = p.weighting;
		}

		fclose(fin);

	}